

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::CollapseButton(ImGuiID id,ImVec2 *pos)

{
  byte bVar1;
  bool bVar2;
  ImU32 IVar3;
  ImU32 col;
  ImRect *in_RSI;
  ImVec2 pos_00;
  ImVec2 IVar4;
  ImVec2 center;
  ImU32 text_col;
  ImU32 bg_col;
  bool pressed;
  bool held;
  bool hovered;
  ImRect bb;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  ImGuiMouseButton button;
  ImVec2 *this;
  ImGuiWindow *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 uVar6;
  ImDrawList *this_00;
  float in_stack_ffffffffffffff8c;
  float in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  float scale;
  float dir;
  ImGuiID in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffad;
  byte in_stack_ffffffffffffffae;
  byte in_stack_ffffffffffffffaf;
  undefined1 local_48 [16];
  ImVec2 local_38;
  ImRect local_30;
  ImGuiWindow *local_20;
  ImGuiContext *local_18;
  int num_segments;
  
  local_18 = GImGui;
  local_20 = GImGui->CurrentWindow;
  this_00 = (ImDrawList *)local_48;
  ImVec2::ImVec2((ImVec2 *)this_00,GImGui->FontSize,GImGui->FontSize);
  local_48._8_8_ =
       operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                 (ImVec2 *)0x175b5d);
  pos_00 = operator*((ImVec2 *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0.0);
  local_38 = operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       (ImVec2 *)0x175b94);
  ImRect::ImRect(&local_30,&in_RSI->Min,&local_38);
  ItemAdd(in_RSI,(ImGuiID)((ulong)this_00 >> 0x20),
          (ImRect *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  bVar1 = ButtonBehavior((ImRect *)
                         CONCAT17(in_stack_ffffffffffffffaf,
                                  CONCAT16(in_stack_ffffffffffffffae,
                                           CONCAT15(in_stack_ffffffffffffffad,
                                                    CONCAT14(in_stack_ffffffffffffffac,
                                                             in_stack_ffffffffffffffa8)))),
                         in_stack_ffffffffffffffa4,
                         (bool *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         (bool *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         (ImGuiButtonFlags)in_stack_ffffffffffffff8c);
  if (((in_stack_ffffffffffffffae & 1) == 0) || ((in_stack_ffffffffffffffaf & 1) == 0)) {
    uVar6 = 0x15;
    if ((in_stack_ffffffffffffffaf & 1) != 0) {
      uVar6 = 0x16;
    }
  }
  else {
    uVar6 = 0x17;
  }
  uVar5 = 0x3f800000;
  IVar3 = GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                      SUB84(in_stack_ffffffffffffff60,0));
  col = GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                    SUB84(in_stack_ffffffffffffff60,0));
  IVar4 = ImRect::GetCenter((ImRect *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48))
  ;
  scale = IVar4.x;
  dir = IVar4.y;
  if (((in_stack_ffffffffffffffaf & 1) != 0) || ((in_stack_ffffffffffffffae & 1) != 0)) {
    in_stack_ffffffffffffff60 = (ImGuiWindow *)local_20->DrawList;
    this = (ImVec2 *)&stack0xffffffffffffff8c;
    ImVec2::ImVec2(this,1.0,0.0);
    num_segments = (int)((ulong)this >> 0x20);
    operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
              (ImVec2 *)0x175cb1);
    ImDrawList::AddCircleFilled
              (this_00,(ImVec2 *)CONCAT44(uVar6,uVar5),
               (float)((ulong)in_stack_ffffffffffffff60 >> 0x20),(ImU32)in_stack_ffffffffffffff60,
               num_segments);
  }
  button = (ImGuiMouseButton)local_20->DrawList;
  operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
            (ImVec2 *)0x175d07);
  RenderArrow((ImDrawList *)
              CONCAT17(in_stack_ffffffffffffffaf,
                       CONCAT16(in_stack_ffffffffffffffae,
                                CONCAT15(bVar1,CONCAT14(in_stack_ffffffffffffffac,IVar3)))),pos_00,
              col,(ImGuiDir)dir,scale);
  bVar2 = IsItemActive();
  if ((bVar2) && (bVar2 = IsMouseDragging(button,in_stack_ffffffffffffff4c), bVar2)) {
    StartMouseMovingWindow(in_stack_ffffffffffffff60);
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool ImGui::CollapseButton(ImGuiID id, const ImVec2& pos)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImRect bb(pos, pos + ImVec2(g.FontSize, g.FontSize) + g.Style.FramePadding * 2.0f);
    ItemAdd(bb, id);
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_None);

    // Render
    ImU32 bg_col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    ImU32 text_col = GetColorU32(ImGuiCol_Text);
    ImVec2 center = bb.GetCenter();
    if (hovered || held) {
        //window->DrawList->AddCircleFilled(center, g.FontSize * 0.5f + 1.0f, bg_col, 12);
        window->DrawList->AddCircleFilled(center + ImVec2(1.0, 0), 0.1f, bg_col, 12);
    }
    RenderArrow(window->DrawList, bb.Min + g.Style.FramePadding, text_col, window->Collapsed ? ImGuiDir_Right : ImGuiDir_Down, 1.0f);

    // Switch to moving the window after mouse is moved beyond the initial drag threshold
    if (IsItemActive() && IsMouseDragging(0))
        StartMouseMovingWindow(window);

    return pressed;
}